

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O0

void __thiscall
despot::MemoryPool<despot::POMDPXState>::NewChunk(MemoryPool<despot::POMDPXState> *this)

{
  Chunk *this_00;
  value_type local_30;
  int local_28;
  int i;
  Chunk *local_18;
  Chunk *chunk;
  MemoryPool<despot::POMDPXState> *this_local;
  
  chunk = (Chunk *)this;
  this_00 = (Chunk *)operator_new(0x3800);
  Chunk::Chunk(this_00);
  local_18 = this_00;
  std::
  vector<despot::MemoryPool<despot::POMDPXState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::POMDPXState>::Chunk_*>_>
  ::push_back(&this->chunks_,&local_18);
  for (local_28 = 0xff; -1 < local_28; local_28 = local_28 + -1) {
    local_30 = local_18->Objects + local_28;
    std::vector<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>::push_back
              (&this->freelist_,&local_30);
    MemoryObject::ClearAllocated(&local_18->Objects[local_28].super_State.super_MemoryObject);
  }
  return;
}

Assistant:

void NewChunk() {
		Chunk* chunk = new Chunk;
		chunks_.push_back(chunk);
		for (int i = Chunk::Size - 1; i >= 0; --i) {
			freelist_.push_back(&chunk->Objects[i]);
			chunk->Objects[i].ClearAllocated();
		}
	}